

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmocka.c
# Opt level: O0

void cmprintf_subunit(cm_printf_type type,char *test_name,char *error_message)

{
  long in_RDX;
  undefined8 in_RSI;
  undefined4 in_EDI;
  
  switch(in_EDI) {
  case 0:
    print_message("test: %s\n",in_RSI);
    break;
  case 1:
    print_message("success: %s\n",in_RSI);
    break;
  case 2:
    print_message("failure: %s",in_RSI);
    if (in_RDX != 0) {
      print_message(" [\n%s\n]\n",in_RDX);
    }
    break;
  case 3:
    print_message("error: %s [ %s ]\n",in_RSI,in_RDX);
    break;
  case 4:
    print_message("skip: %s\n",in_RSI);
  }
  return;
}

Assistant:

static void cmprintf_subunit(enum cm_printf_type type,
                             const char *test_name,
                             const char *error_message)
{
    switch (type) {
    case PRINTF_TEST_START:
        print_message("test: %s\n", test_name);
        break;
    case PRINTF_TEST_SUCCESS:
        print_message("success: %s\n", test_name);
        break;
    case PRINTF_TEST_FAILURE:
        print_message("failure: %s", test_name);
        if (error_message != NULL) {
            print_message(" [\n%s\n]\n", error_message);
        }
        break;
    case PRINTF_TEST_SKIPPED:
        print_message("skip: %s\n", test_name);
        break;
    case PRINTF_TEST_ERROR:
        print_message("error: %s [ %s ]\n", test_name, error_message);
        break;
    }
}